

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stl.h
# Opt level: O1

bool __thiscall
pybind11::detail::
list_caster<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
::load(list_caster<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       *this,handle src,bool convert)

{
  handle hVar1;
  bool bVar2;
  int iVar3;
  size_t __n;
  handle hVar4;
  object *poVar5;
  handle hVar6;
  bool bVar7;
  undefined1 local_90 [8];
  reference it;
  undefined1 local_68 [8];
  value_conv conv;
  object local_40;
  handle local_38;
  sequence s;
  
  if ((src.m_ptr == (PyObject *)0x0) || (iVar3 = PySequence_Check(src.m_ptr), iVar3 == 0)) {
LAB_002a571d:
    bVar7 = false;
  }
  else {
    if (src.m_ptr != (PyObject *)0x0) {
      if (((src.m_ptr)->ob_type->tp_flags & 0x8000000) != 0) goto LAB_002a571d;
      if (src.m_ptr != (PyObject *)0x0) {
        if (((src.m_ptr)->ob_type->tp_flags & 0x10000000) != 0) goto LAB_002a571d;
        if (src.m_ptr != (PyObject *)0x0) {
          (src.m_ptr)->ob_refcnt = (src.m_ptr)->ob_refcnt + 1;
        }
      }
    }
    local_38.m_ptr = src.m_ptr;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::_M_erase_at_end(&this->value,
                      (this->value).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    __n = sequence::size((sequence *)&local_38);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::reserve(&this->value,__n);
    hVar1.m_ptr = local_38.m_ptr;
    hVar4.m_ptr = (PyObject *)PySequence_Size(local_38.m_ptr);
    bVar7 = hVar4.m_ptr == (PyObject *)0x0;
    if (!bVar7) {
      conv.
      super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
      .value.field_2._12_4_ = ZEXT14(convert);
      hVar6.m_ptr = (PyObject *)0x0;
      it.cache.super_handle.m_ptr = (handle)(handle)hVar4.m_ptr;
      do {
        it._0_8_ = hVar1.m_ptr;
        it.key = 0;
        local_68 = (undefined1  [8])
                   &conv.
                    super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                    .value._M_string_length;
        conv.
        super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        .value._M_dataplus._M_p = (pointer)0x0;
        conv.
        super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
        .value._M_string_length._0_1_ = 0;
        it.obj.m_ptr = hVar6.m_ptr;
        poVar5 = accessor<pybind11::detail::accessor_policies::sequence_item>::get_cache
                           ((accessor<pybind11::detail::accessor_policies::sequence_item> *)local_90
                           );
        local_40.super_handle.m_ptr = (handle)(poVar5->super_handle).m_ptr;
        if (local_40.super_handle.m_ptr != (PyObject *)0x0) {
          ((PyObject *)local_40.super_handle.m_ptr)->ob_refcnt =
               ((PyObject *)local_40.super_handle.m_ptr)->ob_refcnt + 1;
        }
        bVar2 = string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                ::load((string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                        *)local_68,local_40.super_handle,
                       SUB41(conv.
                             super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                             .value.field_2._12_4_,0));
        object::~object(&local_40);
        if (!bVar2) {
          if (local_68 !=
              (undefined1  [8])
              &conv.
               super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               .value._M_string_length) {
            operator_delete((void *)local_68,
                            CONCAT71(conv.
                                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     .value._M_string_length._1_7_,
                                     (undefined1)
                                     conv.
                                     super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                     .value._M_string_length) + 1);
          }
          object::~object((object *)&it.key);
          break;
        }
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)this,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68);
        if (local_68 !=
            (undefined1  [8])
            &conv.
             super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
             .value._M_string_length) {
          operator_delete((void *)local_68,
                          CONCAT71(conv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length._1_7_,
                                   (undefined1)
                                   conv.
                                   super_string_caster<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                                   .value._M_string_length) + 1);
        }
        object::~object((object *)&it.key);
        if (!bVar2) break;
        hVar6.m_ptr = (PyObject *)((long)&(hVar6.m_ptr)->ob_refcnt + 1);
        bVar7 = it.cache.super_handle.m_ptr == (handle)hVar6.m_ptr;
      } while (!bVar7);
    }
    object::~object((object *)&local_38);
  }
  return bVar7;
}

Assistant:

bool load(handle src, bool convert) {
        if (!isinstance<sequence>(src) || isinstance<bytes>(src) || isinstance<str>(src))
            return false;
        auto s = reinterpret_borrow<sequence>(src);
        value.clear();
        reserve_maybe(s, &value);
        for (auto it : s) {
            value_conv conv;
            if (!conv.load(it, convert))
                return false;
            value.push_back(cast_op<Value &&>(std::move(conv)));
        }
        return true;
    }